

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

void __thiscall procxx::pipe_streambuf::~pipe_streambuf(pipe_streambuf *this)

{
  pipe_streambuf *this_local;
  
  *(undefined ***)&this->super_pipe_ostreambuf = &PTR__pipe_streambuf_00218488;
  (**(code **)(*(long *)&this->super_pipe_ostreambuf + 0x78))();
  std::vector<char,_std::allocator<char>_>::~vector(&this->out_buffer_);
  pipe_t::~pipe_t(&this->stdin_pipe_);
  pipe_ostreambuf::~pipe_ostreambuf(&this->super_pipe_ostreambuf);
  return;
}

Assistant:

~pipe_streambuf() { flush(); }